

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::UaddCarryCase::getInputValues
          (UaddCarryCase *this,int numValues,void **values)

{
  deUint32 *dst;
  bool bVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision precision_00;
  int iVar3;
  deUint32 dVar4;
  char *str;
  const_reference pvVar5;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  int local_b8;
  int local_b4;
  int compNdx_1;
  int easyCaseNdx_1;
  int compNdx;
  int easyCaseNdx;
  anon_struct_8_2_947311e6 easyCases [8];
  deUint32 *in1;
  deUint32 *in0;
  bool isSigned;
  deUint32 integerMask;
  int integerLength;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  UaddCarryCase *this_local;
  
  rnd.m_rnd._8_8_ = values;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0x235fac);
  this_00 = &(this->super_IntegerFunctionCase).m_spec.inputs;
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  precision_00 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  dVar2 = anon_unknown_3::getShaderUintBitCount
                    ((this->super_IntegerFunctionCase).m_shaderType,precision_00);
  dVar4 = anon_unknown_3::getLowBitMask(dVar2);
  bVar1 = glu::isDataTypeIntOrIVec(dataType);
  dst = *(deUint32 **)rnd.m_rnd._8_8_;
  easyCases[7] = *(anon_struct_8_2_947311e6 *)(rnd.m_rnd._8_8_ + 8);
  memcpy(&compNdx,&DAT_00f31f50,0x40);
  for (easyCaseNdx_1 = 0; easyCaseNdx_1 < 8; easyCaseNdx_1 = easyCaseNdx_1 + 1) {
    for (compNdx_1 = 0; compNdx_1 < iVar3; compNdx_1 = compNdx_1 + 1) {
      dst[easyCaseNdx_1 * iVar3 + compNdx_1] = (&compNdx)[(long)easyCaseNdx_1 * 2] & dVar4;
      *(deUint32 *)((long)easyCases[7] + (long)(easyCaseNdx_1 * iVar3 + compNdx_1) * 4) =
           easyCases[(long)easyCaseNdx_1 + -1].y & dVar4;
    }
  }
  if (bVar1) {
    for (local_b4 = 0; local_b4 < 8; local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < iVar3; local_b8 = local_b8 + 1) {
        dVar4 = anon_unknown_3::extendSignTo32(dst[local_b4 * iVar3 + local_b8],dVar2);
        dst[local_b4 * iVar3 + local_b8] = dVar4;
        dVar4 = anon_unknown_3::extendSignTo32
                          (*(deUint32 *)
                            ((long)easyCases[7] + (long)(local_b4 * iVar3 + local_b8) * 4),dVar2);
        *(deUint32 *)((long)easyCases[7] + (long)(local_b4 * iVar3 + local_b8) * 4) = dVar4;
      }
    }
  }
  anon_unknown_3::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionCase).m_shaderType,dataType,
             precision_00,dst,numValues + -8);
  anon_unknown_3::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionCase).m_shaderType,dataType,
             precision_00,(deUint32 *)easyCases[7],numValues + -8);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0x235facu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			integerMask		= getLowBitMask(integerLength);
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		deUint32*				in0				= (deUint32*)values[0];
		deUint32*				in1				= (deUint32*)values[1];

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0xfffffffeu,	0x00000001u },
			{ 0x00000001u,	0xfffffffeu },
			{ 0xffffffffu,	0x00000001u },
			{ 0x00000001u,	0xffffffffu },
			{ 0xfffffffeu,	0x00000002u },
			{ 0x00000002u,	0xfffffffeu },
			{ 0xffffffffu,	0xffffffffu }
		};

		// generate integers with proper bit count
		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].x & integerMask;
				in1[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].y & integerMask;
			}
		}

		// convert to signed
		if (isSigned)
		{
			for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					in0[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in0[easyCaseNdx*scalarSize + compNdx], integerLength);
					in1[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in1[easyCaseNdx*scalarSize + compNdx], integerLength);
				}
			}
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, in0, numValues - DE_LENGTH_OF_ARRAY(easyCases));
		generateRandomInputData(rnd, m_shaderType, type, precision, in1, numValues - DE_LENGTH_OF_ARRAY(easyCases));
	}